

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<long>::Reserve(RepeatedField<long> *this,int new_size)

{
  int iVar1;
  uint uVar2;
  long *plVar3;
  long *plVar4;
  LogMessage *other;
  undefined8 *puVar5;
  ulong n;
  ulong uVar6;
  Arena *this_00;
  LogMessage local_70;
  LogFinisher local_31;
  
  iVar1 = this->total_size_;
  if (new_size <= iVar1) {
    return;
  }
  if (iVar1 < 1) {
    plVar3 = (long *)0x0;
  }
  else {
    plVar3 = elements(this);
    plVar3 = plVar3 + -1;
    iVar1 = this->total_size_;
  }
  if (iVar1 == 0) {
    this_00 = (Arena *)this->arena_or_elements_;
    iVar1 = 0;
    uVar6 = 4;
    if (new_size < 4) goto LAB_0016c106;
  }
  else {
    plVar4 = elements(this);
    this_00 = (Arena *)plVar4[-1];
    uVar6 = 4;
    if (new_size < 4) goto LAB_0016c106;
    iVar1 = this->total_size_;
    if (0x3fffffff < iVar1) {
      if ((uint)new_size < 0x40000001) {
        internal::LogMessage::LogMessage
                  (&local_70,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
                   ,0x602);
        other = internal::LogMessage::operator<<
                          (&local_70,"CHECK failed: (new_size) > (kRepeatedFieldUpperClampLimit): ")
        ;
        internal::LogFinisher::operator=(&local_31,other);
        internal::LogMessage::~LogMessage(&local_70);
      }
      uVar6 = 0x7fffffff;
      goto LAB_0016c106;
    }
  }
  uVar2 = iVar1 * 2;
  if (iVar1 * 2 <= new_size) {
    uVar2 = new_size;
  }
  uVar6 = (ulong)uVar2;
LAB_0016c106:
  if (this_00 == (Arena *)0x0) {
    puVar5 = (undefined8 *)operator_new(uVar6 * 8 + 8);
  }
  else {
    n = uVar6 * 8 + 0xf & 0x7fffffff8;
    if (*(long *)(this_00 + 0x70) != 0) {
      Arena::OnArenaAllocation(this_00,(type_info *)&char::typeinfo,n);
    }
    puVar5 = (undefined8 *)Arena::AllocateAlignedNoHook(this_00,n);
  }
  *puVar5 = this_00;
  this->total_size_ = (int)uVar6;
  this->arena_or_elements_ = puVar5 + 1;
  elements(this);
  if (0 < this->current_size_) {
    plVar4 = elements(this);
    memcpy(plVar4,plVar3 + 1,(long)this->current_size_ << 3);
  }
  if ((plVar3 != (long *)0x0) && (*plVar3 == 0)) {
    operator_delete(plVar3);
  }
  return;
}

Assistant:

void RepeatedField<Element>::Reserve(int new_size) {
  if (total_size_ >= new_size) return;
  Rep* old_rep = total_size_ > 0 ? rep() : NULL;
  Rep* new_rep;
  Arena* arena = GetArena();
  new_size = internal::CalculateReserveSize(total_size_, new_size);
  GOOGLE_DCHECK_LE(
      static_cast<size_t>(new_size),
      (std::numeric_limits<size_t>::max() - kRepHeaderSize) / sizeof(Element))
      << "Requested size is too large to fit into size_t.";
  size_t bytes =
      kRepHeaderSize + sizeof(Element) * static_cast<size_t>(new_size);
  if (arena == NULL) {
    new_rep = static_cast<Rep*>(::operator new(bytes));
  } else {
    new_rep = reinterpret_cast<Rep*>(Arena::CreateArray<char>(arena, bytes));
  }
  new_rep->arena = arena;
  int old_total_size = total_size_;
  // Already known: new_size >= internal::kMinRepeatedFieldAllocationSize
  // Maintain invariant:
  //     total_size_ == 0 ||
  //     total_size_ >= internal::kMinRepeatedFieldAllocationSize
  total_size_ = new_size;
  arena_or_elements_ = new_rep->elements;
  // Invoke placement-new on newly allocated elements. We shouldn't have to do
  // this, since Element is supposed to be POD, but a previous version of this
  // code allocated storage with "new Element[size]" and some code uses
  // RepeatedField with non-POD types, relying on constructor invocation. If
  // Element has a trivial constructor (e.g., int32), gcc (tested with -O2)
  // completely removes this loop because the loop body is empty, so this has no
  // effect unless its side-effects are required for correctness.
  // Note that we do this before MoveArray() below because Element's copy
  // assignment implementation will want an initialized instance first.
  Element* e = &elements()[0];
  Element* limit = e + total_size_;
  for (; e < limit; e++) {
    new (e) Element;
  }
  if (current_size_ > 0) {
    MoveArray(&elements()[0], old_rep->elements, current_size_);
  }

  // Likewise, we need to invoke destructors on the old array.
  InternalDeallocate(old_rep, old_total_size);

}